

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.cpp
# Opt level: O0

void __thiscall
qclab::qgates::SWAP<std::complex<float>_>::apply
          (SWAP<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int qubit0;
  reference pvVar1;
  complex<float> *vector_00;
  anon_class_8_1_703dd281_conflict1 local_48;
  anon_class_8_1_703dd281_conflict1 f;
  vector<int,_std::allocator<int>_> qubits;
  int offset_local;
  vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector_local;
  int nbQubits_local;
  Op op_local;
  SWAP<std::complex<float>_> *this_local;
  
  (*(this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject[5])
            ();
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f,0);
  *pvVar1 = *pvVar1 + offset;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f,1);
  *pvVar1 = *pvVar1 + offset;
  vector_00 = std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>::data(vector);
  local_48 = lambda_SWAP<std::complex<float>>(op,vector_00);
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f,0);
  qubit0 = *pvVar1;
  pvVar1 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)&f,1);
  apply4bc<qclab::qgates::lambda_SWAP<std::complex<float>>(qclab::Op,std::complex<float>*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,qubit0,*pvVar1,&local_48);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&f);
  return;
}

Assistant:

void SWAP< T >::apply( Op op , const int nbQubits , std::vector< T >& vector ,
                         const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_SWAP( op , vector.data() ) ;
    apply4bc( nbQubits , qubits[0] , qubits[1] , f ) ;
  }